

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError TestParameters(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *parameters,
                      double sampleRate,StreamDirection streamDir)

{
  PaSampleFormat PVar1;
  long lVar2;
  size_t sVar3;
  code *pcVar4;
  StreamDirection SVar5;
  PaStreamParameters *hostApi_00;
  int iVar6;
  int iVar7;
  snd_pcm_format_t sVar8;
  PaAlsaDeviceInfo *__n;
  long *__s;
  PaSampleFormat availableFormats_00;
  snd_pcm_hw_params_t *paFormat;
  pthread_t pVar9;
  long alStack_b0 [2];
  long local_a0;
  PaHostApiTypeId PStack_9c;
  PaSampleFormat local_98;
  size_t local_90;
  code *local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  StreamDirection local_6c;
  StreamDirection local_68;
  int __pa_unsure_error_id_1;
  int ret;
  int __pa_unsure_error_id;
  PaAlsaDeviceInfo *devInfo;
  size_t __alsa_alloca_size;
  snd_pcm_hw_params_t *hwParams;
  PaSampleFormat hostFormat;
  PaSampleFormat PStack_38;
  uint numHostChannels;
  PaSampleFormat availableFormats;
  snd_pcm_t *pcm;
  PaError result;
  StreamDirection streamDir_local;
  double sampleRate_local;
  PaStreamParameters *parameters_local;
  PaUtilHostApiRepresentation *hostApi_local;
  
  pcm._0_4_ = 0;
  availableFormats = 0;
  alStack_b0[0] = 0x117973;
  pcm._4_4_ = streamDir;
  _result = sampleRate;
  sampleRate_local = (double)parameters;
  parameters_local = (PaStreamParameters *)hostApi;
  __n = (PaAlsaDeviceInfo *)(*(code *)alsa_snd_pcm_hw_params_sizeof)();
  lVar2 = -((ulong)((long)&(__n->baseDeviceInfo).name + 7U) & 0xfffffffffffffff0);
  __s = (long *)((long)alStack_b0 + lVar2 + 8);
  devInfo = __n;
  __alsa_alloca_size = (size_t)__s;
  *(undefined8 *)((long)alStack_b0 + lVar2) = 0x11799f;
  memset(__s,0,(size_t)__n);
  hostApi_00 = parameters_local;
  if (*(long *)((long)sampleRate_local + 0x18) == 0) {
    iVar7 = *(int *)sampleRate_local;
    *(undefined8 *)((long)alStack_b0 + lVar2) = 0x1179b9;
    _ret = GetDeviceInfo((PaUtilHostApiRepresentation *)hostApi_00,iVar7);
    local_70 = *(int *)((long)sampleRate_local + 4);
    if (pcm._4_4_ == StreamDirection_In) {
      local_74 = _ret->minInputChannels;
    }
    else {
      local_74 = _ret->minOutputChannels;
    }
    if (local_74 < *(int *)((long)sampleRate_local + 4)) {
      local_78 = *(int *)((long)sampleRate_local + 4);
    }
    else {
      if (pcm._4_4_ == StreamDirection_In) {
        local_7c = _ret->minInputChannels;
      }
      else {
        local_7c = _ret->minOutputChannels;
      }
      local_78 = local_7c;
    }
    hostFormat._4_4_ = local_78;
  }
  else {
    hostFormat._4_4_ = *(int *)((long)sampleRate_local + 4);
  }
  *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117a45;
  paUtilErr_ = AlsaOpen(*(PaUtilHostApiRepresentation **)((long)&ret + lVar2),
                        *(PaStreamParameters **)((long)&stack0xffffffffffffff98 + lVar2),
                        *(StreamDirection *)((long)&local_6c + lVar2),
                        *(snd_pcm_t ***)((long)&local_78 + lVar2));
  PVar1 = availableFormats;
  sVar3 = __alsa_alloca_size;
  if (paUtilErr_ < 0) {
    *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117a6c;
    PaUtil_DebugPrint(
                     "Expression \'AlsaOpen( hostApi, parameters, streamDir, &pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1767\n"
                     );
    pcm._0_4_ = paUtilErr_;
  }
  else {
    *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117a8d;
    (*(code *)alsa_snd_pcm_hw_params_any)(PVar1,sVar3);
    *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117a9f;
    iVar6 = SetApproximateSampleRate
                      (*(snd_pcm_t **)((long)&ret + lVar2),
                       *(snd_pcm_hw_params_t **)((long)&stack0xffffffffffffff98 + lVar2),
                       *(double *)((long)&local_70 + lVar2));
    PVar1 = availableFormats;
    iVar7 = hostFormat._4_4_;
    sVar3 = __alsa_alloca_size;
    if (iVar6 < 0) {
      pcm._0_4_ = -0x270d;
    }
    else {
      *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117ac4;
      iVar7 = (*(code *)alsa_snd_pcm_hw_params_set_channels)(PVar1,sVar3,iVar7);
      PVar1 = availableFormats;
      if (iVar7 < 0) {
        pcm._0_4_ = -0x270e;
      }
      else {
        *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117ade;
        availableFormats_00 = GetAvailableFormats((snd_pcm_t *)PVar1);
        PVar1 = *(PaSampleFormat *)((long)sampleRate_local + 8);
        PStack_38 = availableFormats_00;
        *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117af3;
        paFormat = (snd_pcm_hw_params_t *)
                   PaUtil_SelectClosestAvailableFormat(availableFormats_00,PVar1);
        hwParams = paFormat;
        paUtilErr_ = (PaError)paFormat;
        if (paUtilErr_ < 0) {
          *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117b1e;
          PaUtil_DebugPrint(
                           "Expression \'hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1785\n"
                           );
          pcm._0_4_ = paUtilErr_;
        }
        else {
          local_88 = (code *)alsa_snd_pcm_hw_params_set_format;
          local_98 = availableFormats;
          local_90 = __alsa_alloca_size;
          *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117b5a;
          sVar8 = Pa2AlsaFormat((PaSampleFormat)paFormat);
          pcVar4 = local_88;
          sVar3 = local_90;
          PVar1 = local_98;
          *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117b70;
          __pa_unsure_error_id_1 = (*pcVar4)(PVar1,sVar3,sVar8);
          PVar1 = availableFormats;
          sVar3 = __alsa_alloca_size;
          if (__pa_unsure_error_id_1 < 0) {
            *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117b8b;
            pVar9 = pthread_self();
            *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117b9d;
            iVar6 = pthread_equal(pVar9,paUnixMainThread);
            iVar7 = __pa_unsure_error_id_1;
            if (iVar6 != 0) {
              local_a0 = (long)__pa_unsure_error_id_1;
              *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117bb9;
              (*alsa_snd_strerror)(iVar7);
              *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117bcd;
              PaUtil_SetLastHostErrorInfo
                        (*(PaHostApiTypeId *)((long)&PStack_9c + lVar2),*__s,
                         *(char **)((long)alStack_b0 + lVar2));
            }
            *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117bdb;
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1788\n"
                             );
            pcm._0_4_ = -9999;
          }
          else {
            local_68 = 0;
            *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117c01;
            local_68 = (*(code *)alsa_snd_pcm_hw_params)(PVar1,sVar3);
            if ((int)local_68 < 0) {
              if (local_68 == 0xffffffea) {
                pcm._0_4_ = -0x2709;
              }
              else {
                if (local_68 == 0xfffffff0) {
                  pcm._0_4_ = -0x2701;
                }
                else {
                  pcm._0_4_ = -9999;
                }
                local_6c = local_68;
                if ((int)local_68 < 0) {
                  if ((PaError)pcm == -9999) {
                    *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117c68;
                    pVar9 = pthread_self();
                    *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117c7a;
                    iVar7 = pthread_equal(pVar9,paUnixMainThread);
                    SVar5 = local_6c;
                    if (iVar7 != 0) {
                      alStack_b0[1] = (long)(int)local_6c;
                      *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117c96;
                      (*alsa_snd_strerror)(SVar5);
                      *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117caa;
                      PaUtil_SetLastHostErrorInfo
                                (*(PaHostApiTypeId *)((long)&PStack_9c + lVar2),*__s,
                                 *(char **)((long)alStack_b0 + lVar2));
                    }
                  }
                  *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117cb8;
                  PaUtil_DebugPrint(
                                   "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1811\n"
                                   );
                }
              }
            }
          }
        }
      }
    }
  }
  PVar1 = availableFormats;
  if (availableFormats != 0) {
    *(undefined8 *)((long)alStack_b0 + lVar2) = 0x117ce5;
    (*(code *)alsa_snd_pcm_close)(PVar1);
  }
  return (PaError)pcm;
}

Assistant:

static PaError TestParameters( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *parameters,
        double sampleRate, StreamDirection streamDir )
{
    PaError result = paNoError;
    snd_pcm_t *pcm = NULL;
    PaSampleFormat availableFormats;
    /* We are able to adapt to a number of channels less than what the device supports */
    unsigned int numHostChannels;
    PaSampleFormat hostFormat;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    if( !parameters->hostApiSpecificStreamInfo )
    {
        const PaAlsaDeviceInfo *devInfo = GetDeviceInfo( hostApi, parameters->device );
        numHostChannels = PA_MAX( parameters->channelCount, StreamDirection_In == streamDir ?
                devInfo->minInputChannels : devInfo->minOutputChannels );
    }
    else
        numHostChannels = parameters->channelCount;

    PA_ENSURE( AlsaOpen( hostApi, parameters, streamDir, &pcm ) );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( SetApproximateSampleRate( pcm, hwParams, sampleRate ) < 0 )
    {
        result = paInvalidSampleRate;
        goto error;
    }

    if( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, numHostChannels ) < 0 )
    {
        result = paInvalidChannelCount;
        goto error;
    }

    /* See if we can find a best possible match */
    availableFormats = GetAvailableFormats( pcm );
    PA_ENSURE( hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat ) );

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) ), paUnanticipatedHostError );

    {
        /* It happens that this call fails because the device is busy */
        int ret = 0;
        if( ( ret = alsa_snd_pcm_hw_params( pcm, hwParams ) ) < 0 )
        {
            if( -EINVAL == ret )
            {
                /* Don't know what to return here */
                result = paBadIODeviceCombination;
                goto error;
            }
            else if( -EBUSY == ret )
            {
                result = paDeviceUnavailable;
                PA_DEBUG(( "%s: Device is busy\n", __FUNCTION__ ));
            }
            else
            {
                result = paUnanticipatedHostError;
            }

            ENSURE_( ret, result );
        }
    }

end:
    if( pcm )
    {
        alsa_snd_pcm_close( pcm );
    }
    return result;

error:
    goto end;
}